

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O3

unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> __thiscall
QEvdevKeyboardHandler::create
          (QEvdevKeyboardHandler *this,QString *device,QString *specification,
          QString *defaultKeymapFile)

{
  char16_t *pcVar1;
  long lVar2;
  long lVar3;
  Data *pDVar4;
  QArrayData *pQVar5;
  char cVar6;
  CutResult CVar7;
  QFdContainer __fd;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  int *piVar11;
  QEvdevKeyboardHandler *this_00;
  qsizetype qVar12;
  long lVar13;
  QChar *pQVar14;
  storage_type_conflict *psVar15;
  longlong lVar16;
  char *pcVar17;
  long lVar18;
  long in_FS_OFFSET;
  QStringView QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QLatin1String QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  ulong local_d0;
  ulong local_c8;
  bool local_c0;
  bool local_b8;
  ulong local_b0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88;
  QString local_78;
  qsizetype local_60;
  QString local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::qLcEvdevKey();
  if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58.d.d._0_4_ = 2;
    local_58.d.d._4_4_ = 0;
    local_58.d.ptr._0_4_ = 0;
    local_58.d.ptr._4_4_ = 0;
    local_58.d.size._0_4_ = 0;
    local_58.d.size._4_4_ = 0;
    local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
    uVar8 = QString::utf16();
    uVar9 = QString::utf16();
    QMessageLogger::debug
              ((char *)&local_58,"Try to create keyboard handler for \"%ls\" \"%ls\"",uVar8,uVar9);
  }
  local_78.d.d = (defaultKeymapFile->d).d;
  local_78.d.ptr = (defaultKeymapFile->d).ptr;
  local_78.d.size = (defaultKeymapFile->d).size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  pcVar1 = (specification->d).ptr;
  qVar12 = (specification->d).size;
  local_58.d.d._0_4_ = (int)qVar12;
  local_58.d.d._4_4_ = (int)((ulong)qVar12 >> 0x20);
  local_58.d.ptr._0_4_ = SUB84(pcVar1,0);
  local_58.d.ptr._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  QStringView::split(&local_98,&local_58,0x3a,0,1);
  if (local_88 == (undefined1 *)0x0) {
    local_d0 = 0;
    local_b0._0_4_ = 400;
    local_c8._0_4_ = 0x50;
    local_b8 = false;
    local_c0 = false;
  }
  else {
    lVar3 = CONCAT44(uStack_8c,uStack_90);
    lVar13 = (long)local_88 << 4;
    local_c8 = 0x50;
    local_b0 = 400;
    lVar18 = 0;
    local_c0 = false;
    local_b8 = false;
    local_d0 = 0;
    do {
      lVar2 = *(long *)(lVar3 + lVar18);
      psVar15 = *(storage_type_conflict **)(lVar3 + 8 + lVar18);
      QVar19.m_data = psVar15;
      QVar19.m_size = lVar2;
      QVar28.m_data = "keymap=";
      QVar28.m_size = 7;
      cVar6 = QtPrivate::startsWith(QVar19,QVar28,CaseSensitive);
      if (cVar6 == '\0') {
        if (lVar2 == 0xe) {
          QVar21.m_data = "enable-compose";
          QVar21.m_size = 0xe;
          QVar30.m_data = psVar15;
          QVar30.m_size = 0xe;
          cVar6 = QtPrivate::equalStrings(QVar21,QVar30);
          if (cVar6 == '\0') goto LAB_00107dc9;
          local_b8 = true;
          pQVar5 = &(local_78.d.d)->super_QArrayData;
        }
        else if ((lVar2 == 0xb) &&
                (QVar20.m_data = "disable-zap", QVar20.m_size = 0xb, QVar29.m_data = psVar15,
                QVar29.m_size = 0xb, cVar6 = QtPrivate::equalStrings(QVar20,QVar29), cVar6 != '\0'))
        {
          local_c0 = true;
          pQVar5 = &(local_78.d.d)->super_QArrayData;
        }
        else {
LAB_00107dc9:
          QVar22.m_data = psVar15;
          QVar22.m_size = lVar2;
          QVar31.m_data = "repeat-delay=";
          QVar31.m_size = 0xd;
          cVar6 = QtPrivate::startsWith(QVar22,QVar31,CaseSensitive);
          if (cVar6 == '\0') {
            QVar24.m_data = psVar15;
            QVar24.m_size = lVar2;
            QVar32.m_data = "repeat-rate=";
            QVar32.m_size = 0xc;
            cVar6 = QtPrivate::startsWith(QVar24,QVar32,CaseSensitive);
            if (cVar6 == '\0') {
              QVar26.m_data = psVar15;
              QVar26.m_size = lVar2;
              QVar33.m_data = "grab=";
              QVar33.m_size = 5;
              cVar6 = QtPrivate::startsWith(QVar26,QVar33,CaseSensitive);
              pQVar5 = &(local_78.d.d)->super_QArrayData;
              if (cVar6 != '\0') {
                local_58.d.d._0_4_ = 5;
                local_58.d.d._4_4_ = 0;
                local_60 = -1;
                CVar7 = QtPrivate::QContainerImplHelper::mid
                                  (*(qsizetype *)(lVar3 + lVar18),(qsizetype *)&local_58,&local_60);
                psVar15 = (storage_type_conflict *)0x0;
                lVar16 = 0;
                if (CVar7 != Null) {
                  psVar15 = (storage_type_conflict *)
                            (CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d) * 2 +
                            *(long *)(lVar3 + 8 + lVar18));
                  lVar16 = local_60;
                }
                QVar27.m_data = psVar15;
                QVar27.m_size = lVar16;
                uVar10 = QString::toIntegral_helper(QVar27,(bool *)0x0,10);
                local_d0 = uVar10 & 0xffffffff;
                pQVar5 = &(local_78.d.d)->super_QArrayData;
                if ((long)(int)uVar10 != uVar10) {
                  local_d0 = 0;
                }
              }
            }
            else {
              local_58.d.d._0_4_ = 0xc;
              local_58.d.d._4_4_ = 0;
              local_60 = -1;
              CVar7 = QtPrivate::QContainerImplHelper::mid
                                (*(qsizetype *)(lVar3 + lVar18),(qsizetype *)&local_58,&local_60);
              psVar15 = (storage_type_conflict *)0x0;
              lVar16 = 0;
              if (CVar7 != Null) {
                psVar15 = (storage_type_conflict *)
                          (CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d) * 2 +
                          *(long *)(lVar3 + 8 + lVar18));
                lVar16 = local_60;
              }
              QVar25.m_data = psVar15;
              QVar25.m_size = lVar16;
              uVar10 = QString::toIntegral_helper(QVar25,(bool *)0x0,10);
              local_c8 = uVar10 & 0xffffffff;
              pQVar5 = &(local_78.d.d)->super_QArrayData;
              if ((long)(int)uVar10 != uVar10) {
                local_c8 = 0;
              }
            }
          }
          else {
            local_58.d.d._0_4_ = 0xd;
            local_58.d.d._4_4_ = 0;
            local_60 = -1;
            CVar7 = QtPrivate::QContainerImplHelper::mid
                              (*(qsizetype *)(lVar3 + lVar18),(qsizetype *)&local_58,&local_60);
            psVar15 = (storage_type_conflict *)0x0;
            lVar16 = 0;
            if (CVar7 != Null) {
              psVar15 = (storage_type_conflict *)
                        (CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d) * 2 +
                        *(long *)(lVar3 + 8 + lVar18));
              lVar16 = local_60;
            }
            QVar23.m_data = psVar15;
            QVar23.m_size = lVar16;
            uVar10 = QString::toIntegral_helper(QVar23,(bool *)0x0,10);
            local_b0 = uVar10 & 0xffffffff;
            pQVar5 = &(local_78.d.d)->super_QArrayData;
            if ((long)(int)uVar10 != uVar10) {
              local_b0 = 0;
            }
          }
        }
      }
      else {
        local_58.d.d._0_4_ = 7;
        local_58.d.d._4_4_ = 0;
        local_60 = -1;
        CVar7 = QtPrivate::QContainerImplHelper::mid
                          (*(qsizetype *)(lVar3 + lVar18),(qsizetype *)&local_58,&local_60);
        if (CVar7 == Null) {
          qVar12 = 0;
          pQVar14 = (QChar *)0x0;
        }
        else {
          pQVar14 = (QChar *)(CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d) * 2 +
                             *(long *)(lVar3 + 8 + lVar18));
          qVar12 = local_60;
        }
        QString::QString(&local_58,pQVar14,qVar12);
        pDVar4 = local_78.d.d;
        pQVar5 = (QArrayData *)CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d);
        pcVar1 = (char16_t *)CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
        local_58.d.d._0_4_ = (int)local_78.d.d;
        local_58.d.d._4_4_ = (int)((ulong)local_78.d.d >> 0x20);
        qVar12 = CONCAT44(local_58.d.size._4_4_,(undefined4)local_58.d.size);
        local_58.d.ptr._0_4_ = SUB84(local_78.d.ptr,0);
        local_58.d.ptr._4_4_ = (undefined4)((ulong)local_78.d.ptr >> 0x20);
        local_58.d.size._0_4_ = (undefined4)local_78.d.size;
        local_58.d.size._4_4_ = (undefined4)((ulong)local_78.d.size >> 0x20);
        local_78.d.ptr = pcVar1;
        local_78.d.size = qVar12;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            local_78.d.d = (Data *)pQVar5;
            QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
            pQVar5 = &(local_78.d.d)->super_QArrayData;
          }
        }
      }
      local_78.d.d = (Data *)pQVar5;
      lVar18 = lVar18 + 0x10;
    } while (lVar13 != lVar18);
  }
  QtPrivateLogging::qLcEvdevKey();
  if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58.d.d._0_4_ = 2;
    local_58.d.d._4_4_ = 0;
    local_58.d.ptr._0_4_ = 0;
    local_58.d.ptr._4_4_ = 0;
    local_58.d.size._0_4_ = 0;
    local_58.d.size._4_4_ = 0;
    local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
    uVar8 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"Opening keyboard at %ls",uVar8);
  }
  QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)(device->d).ptr);
  pcVar17 = (char *)CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
  if (pcVar17 == (char *)0x0) {
    pcVar17 = (char *)&QByteArray::_empty;
  }
  do {
    __fd.m_fd = open64(pcVar17,0x80802,0);
    if (__fd.m_fd != -1) break;
    piVar11 = __errno_location();
  } while (*piVar11 == 4);
  local_60 = CONCAT44(local_60._4_4_,__fd.m_fd);
  piVar11 = (int *)CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d),1,0x10);
    }
    __fd.m_fd = local_60._0_4_;
  }
  if (__fd.m_fd < 0) {
    QtPrivateLogging::qLcEvdevKey();
    if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
               _M_i & 1) != 0) {
      local_58.d.d._0_4_ = 2;
      local_58.d.d._4_4_ = 0;
      local_58.d.ptr._0_4_ = 0;
      local_58.d.ptr._4_4_ = 0;
      local_58.d.size._0_4_ = 0;
      local_58.d.size._4_4_ = 0;
      local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
      QMessageLogger::debug
                ((char *)&local_58,
                 "Keyboard device could not be opened as read-write, trying read-only");
    }
    QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)(device->d).ptr);
    pcVar17 = (char *)CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
    if (pcVar17 == (char *)0x0) {
      pcVar17 = (char *)&QByteArray::_empty;
    }
    do {
      __fd.m_fd = open64(pcVar17,0x80800,0);
      if (__fd.m_fd != -1) break;
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    QFdContainer::reset((QFdContainer *)&local_60);
    local_60 = CONCAT44(local_60._4_4_,__fd.m_fd);
    piVar11 = (int *)CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,(int)local_58.d.d),1,0x10);
      }
      __fd.m_fd = local_60._0_4_;
    }
    if (__fd.m_fd < 0) {
      uVar8 = QString::utf16();
      this_00 = (QEvdevKeyboardHandler *)0x0;
      qErrnoWarning("Cannot open keyboard input device \'%ls\'",uVar8);
      goto LAB_001081cf;
    }
  }
  ioctl(__fd.m_fd,0x40044590,local_d0);
  if ((0 < (int)local_b0) && (0 < (int)local_c8)) {
    local_58.d.d._0_4_ = (int)local_b0;
    local_58.d.d._4_4_ = (int)local_c8;
    ioctl(local_60._0_4_,0x40084503);
  }
  this_00 = (QEvdevKeyboardHandler *)operator_new(0x68);
  QEvdevKeyboardHandler(this_00,device,(QFdContainer *)&local_60,local_c0,local_b8,&local_78);
LAB_001081cf:
  *(QEvdevKeyboardHandler **)this = this_00;
  QFdContainer::reset((QFdContainer *)&local_60);
  piVar11 = (int *)CONCAT44(uStack_94,local_98);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),0x10,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>,_true,_true>
          )(__uniq_ptr_data<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<QEvdevKeyboardHandler> QEvdevKeyboardHandler::create(const QString &device,
                                                     const QString &specification,
                                                     const QString &defaultKeymapFile)
{
    qCDebug(qLcEvdevKey, "Try to create keyboard handler for \"%ls\" \"%ls\"",
            qUtf16Printable(device), qUtf16Printable(specification));

    QString keymapFile = defaultKeymapFile;
    int repeatDelay = 400;
    int repeatRate = 80;
    bool disableZap = false;
    bool enableCompose = false;
    int grab = 0;

    const auto args = QStringView{specification}.split(u':');
    for (const auto &arg : args) {
        if (arg.startsWith("keymap="_L1))
            keymapFile = arg.mid(7).toString();
        else if (arg == "disable-zap"_L1)
            disableZap = true;
        else if (arg == "enable-compose"_L1)
            enableCompose = true;
        else if (arg.startsWith("repeat-delay="_L1))
            repeatDelay = arg.mid(13).toInt();
        else if (arg.startsWith("repeat-rate="_L1))
            repeatRate = arg.mid(12).toInt();
        else if (arg.startsWith("grab="_L1))
            grab = arg.mid(5).toInt();
    }

    qCDebug(qLcEvdevKey, "Opening keyboard at %ls", qUtf16Printable(device));

    QFdContainer fd(qt_safe_open(device.toLocal8Bit().constData(), O_RDWR | O_NDELAY, 0));
    if (fd.get() < 0) {
        qCDebug(qLcEvdevKey, "Keyboard device could not be opened as read-write, trying read-only");
        fd.reset(qt_safe_open(device.toLocal8Bit().constData(), O_RDONLY | O_NDELAY, 0));
    }
    if (fd.get() >= 0) {
        ::ioctl(fd.get(), EVIOCGRAB, grab);
        if (repeatDelay > 0 && repeatRate > 0) {
            int kbdrep[2] = { repeatDelay, repeatRate };
            ::ioctl(fd.get(), EVIOCSREP, kbdrep);
        }

        return std::unique_ptr<QEvdevKeyboardHandler>(new QEvdevKeyboardHandler(device, fd, disableZap, enableCompose, keymapFile));
    } else {
        qErrnoWarning("Cannot open keyboard input device '%ls'", qUtf16Printable(device));
        return nullptr;
    }
}